

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::RandomBernoulliLikeLayerParams::MergePartialFromCodedStream
          (RandomBernoulliLikeLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  undefined8 in_RAX;
  int iVar8;
  ulong uVar9;
  int iVar10;
  pair<unsigned_long,_bool> pVar11;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00142ad2;
      input->buffer_ = pbVar3 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00142ad2:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    iVar10 = 6;
    iVar8 = iVar10;
    if ((uVar9 & 0x100000000) == 0) {
LAB_00142b52:
      iVar8 = 7;
      if (((uVar6 & 7) != 4 && uVar6 != 0) &&
         (bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6), iVar8 = iVar10
         , bVar5)) {
LAB_00142b77:
        iVar8 = 0;
      }
    }
    else {
      uVar7 = (uint)(uVar9 >> 3) & 0x1fffffff;
      if (uVar7 == 2) {
        if ((char)uVar9 != '\x15') goto LAB_00142b52;
        puVar4 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)((long)&uStack_38 + 4));
          if (!bVar5) goto LAB_00142b79;
        }
        else {
          uStack_38 = CONCAT44(*(undefined4 *)puVar4,(undefined4)uStack_38);
          input->buffer_ = puVar4 + 4;
        }
        this->prob_ = uStack_38._4_4_;
        goto LAB_00142b77;
      }
      if ((uVar7 != 1) || ((char)uVar9 != '\b')) goto LAB_00142b52;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar11._8_8_ = 1;
        pVar11.first = (long)(char)uVar2;
      }
      else {
        pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->seed_ = pVar11.first;
        goto LAB_00142b77;
      }
    }
LAB_00142b79:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool RandomBernoulliLikeLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.RandomBernoulliLikeLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 seed = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &seed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float prob = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &prob_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.RandomBernoulliLikeLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.RandomBernoulliLikeLayerParams)
  return false;
#undef DO_
}